

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:817:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  ostringstream *poVar2;
  NATHolePuncher *pNVar3;
  ulong uVar4;
  undefined8 uVar5;
  Connection *this;
  OutputWorker *pOVar6;
  uint64_t value;
  uint64_t value_00;
  ushort uVar7;
  ulong key;
  address local_250;
  type handler;
  string local_1f8;
  string local_1d8;
  ptr local_1b8;
  LogStringBuffer local_1a0;
  
  local_1b8.h = &handler;
  handler.this = (Connection *)base[1].next_;
  handler.addr.impl_.data_._0_8_ = base[1].func_;
  uVar5 = *(undefined8 *)((long)&base[2].next_ + 4);
  handler.addr.impl_.data_._8_4_ = (undefined4)*(undefined8 *)&base[1].task_result_;
  handler.addr.impl_.data_._12_4_ = (undefined4)*(undefined8 *)&base[1].field_0x14;
  handler.addr.impl_.data_._16_4_ = (undefined4)((ulong)*(undefined8 *)&base[1].field_0x14 >> 0x20);
  handler.addr.impl_.data_._20_4_ = (undefined4)uVar5;
  handler.addr.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)((long)&base[2].func_ + 4);
  handler.key = (uint32_t)uVar5;
  handler.addrMap._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  handler.addrMap._4_4_ = (undefined4)*(undefined8 *)&base[2].field_0x14;
  handler.sender._0_4_ = (undefined4)((ulong)*(undefined8 *)&base[2].field_0x14 >> 0x20);
  handler.sender._4_4_ = *(undefined4 *)((long)&base[3].next_ + 4);
  local_1b8.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:817:27)>
                 *)base;
  local_1b8.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:817:27)>
                 *)base;
  ptr::reset(&local_1b8);
  this = handler.this;
  if (owner != (void *)0x0) {
    pNVar3 = ((handler.this)->HolePuncher)._M_t.
             super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
             ._M_t.
             super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
             .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
    if (pNVar3 == (NATHolePuncher *)0x0) {
      if ((int)((handler.this)->Logger).ChannelMinLevel < 4) {
        local_1a0.ChannelName = ((handler.this)->Logger).ChannelName;
        poVar2 = &local_1a0.LogStream;
        local_1a0.LogLevel = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,(string *)&(this->Logger).Prefix);
        std::operator<<((ostream *)poVar2,"Ignoring NAT probe from unrelated port");
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,&local_1a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      }
    }
    else {
      local_250.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(in4_addr_type)handler.addr.impl_.data_.v6.sin6_flowinfo;
      if (((pNVar3->SeenProbe)._M_base._M_i & 1U) == 0) {
        LOCK();
        ((((handler.this)->HolePuncher)._M_t.
          super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>.
          _M_t.
          super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
          .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl)->SeenProbe)._M_base.
        _M_i = true;
        UNLOCK();
        if (handler.addr.impl_.data_.base.sa_family != 2) {
          local_250.ipv6_address_.addr_.__in6_u._0_8_ =
               CONCAT44(handler.addr.impl_.data_._12_4_,handler.addr.impl_.data_._8_4_);
          local_250.ipv6_address_.addr_.__in6_u._8_8_ =
               CONCAT44(handler.addr.impl_.data_._20_4_,handler.addr.impl_.data_._16_4_);
          local_250.ipv6_address_.scope_id_ =
               (unsigned_long)handler.addr.impl_.data_.v6.sin6_scope_id;
          local_250.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_250.ipv6_address_.scope_id_ = 0;
          local_250.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          local_250.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        }
        local_250.type_ = (anon_enum_32)(handler.addr.impl_.data_.base.sa_family != 2);
        asio::ip::address::to_string_abi_cxx11_(&local_1d8,&local_250);
        uVar7 = swap_bytes(handler.addr.impl_.data_.v4.sin_port);
        tonk::HexString_abi_cxx11_(&local_1f8,(tonk *)(ulong)handler.key,value_00);
        if ((int)(this->Logger).ChannelMinLevel < 4) {
          local_1a0.ChannelName = (this->Logger).ChannelName;
          poVar2 = &local_1a0.LogStream;
          local_1a0.LogLevel = Warning;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,(string *)&(this->Logger).Prefix);
          std::operator<<((ostream *)poVar2,"NAT probe from ");
          std::operator<<((ostream *)poVar2,(string *)&local_1d8);
          std::operator<<((ostream *)poVar2," : ");
          std::ostream::operator<<((ostream *)poVar2,uVar7);
          std::operator<<((ostream *)poVar2," - key = ");
          std::operator<<((ostream *)poVar2,(string *)&local_1f8);
          pOVar6 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar6,&local_1a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        }
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d8);
        pNVar3 = (this->HolePuncher)._M_t.
                 super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
                 .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
        uVar4 = (pNVar3->StartParams).EncryptionKey;
        key = uVar4 >> 0x20 | uVar4 << 0x20;
        if ((pNVar3->StartParams).WinTies == false) {
          key = uVar4;
        }
        tonk::SessionOutgoing::StartHandshakePeer2PeerConnect(&this->Outgoing,key);
        tonk::Connection::setPeerAddressAndSource
                  (this,(ConnectionAddrMap *)CONCAT44(handler.addrMap._4_4_,handler.addrMap._0_4_),
                   (IUDPSender *)CONCAT44(handler.sender._4_4_,handler.sender._0_4_),&handler.addr);
      }
      else {
        if (handler.addr.impl_.data_.base.sa_family != 2) {
          local_250.ipv6_address_.addr_.__in6_u._0_8_ =
               CONCAT44(handler.addr.impl_.data_._12_4_,handler.addr.impl_.data_._8_4_);
          local_250.ipv6_address_.addr_.__in6_u._8_8_ =
               CONCAT44(handler.addr.impl_.data_._20_4_,handler.addr.impl_.data_._16_4_);
          local_250.ipv6_address_.scope_id_ =
               (unsigned_long)handler.addr.impl_.data_.v6.sin6_scope_id;
          local_250.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_250.ipv6_address_.scope_id_ = 0;
          local_250.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          local_250.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        }
        local_250.type_ = (anon_enum_32)(handler.addr.impl_.data_.base.sa_family != 2);
        asio::ip::address::to_string_abi_cxx11_(&local_1d8,&local_250);
        uVar7 = swap_bytes(handler.addr.impl_.data_.v4.sin_port);
        tonk::HexString_abi_cxx11_(&local_1f8,(tonk *)(ulong)handler.key,value);
        if ((int)(this->Logger).ChannelMinLevel < 4) {
          local_1a0.ChannelName = (this->Logger).ChannelName;
          poVar2 = &local_1a0.LogStream;
          local_1a0.LogLevel = Warning;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,(string *)&(this->Logger).Prefix);
          std::operator<<((ostream *)poVar2,"Ignoring extra probe from ");
          std::operator<<((ostream *)poVar2,(string *)&local_1d8);
          std::operator<<((ostream *)poVar2," : ");
          std::ostream::operator<<((ostream *)poVar2,uVar7);
          std::operator<<((ostream *)poVar2," - key = ");
          std::operator<<((ostream *)poVar2,(string *)&local_1f8);
          pOVar6 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar6,&local_1a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        }
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
    }
    LOCK();
    paVar1 = &(this->super_IConnection).SelfRefCount.RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  ptr::~ptr(&local_1b8);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }